

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O0

int __thiscall QTextFragment::position(QTextFragment *this)

{
  QFragmentMap<QTextFragmentData> *in_RDI;
  QFragmentMap<QTextFragmentData> *this_00;
  uint local_4;
  
  if (((in_RDI->data).field_0.head == (Header *)0x0) || (*(int *)&in_RDI[1].data.field_0 == 0)) {
    local_4 = 0;
  }
  else {
    this_00 = in_RDI;
    QTextDocumentPrivate::fragmentMap((QTextDocumentPrivate *)(in_RDI->data).field_0.head);
    local_4 = QFragmentMap<QTextFragmentData>::position
                        (this_00,(uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
  }
  return local_4;
}

Assistant:

int QTextFragment::position() const
{
    if (!p || !n)
        return 0; // ### -1 instead?

    return p->fragmentMap().position(n);
}